

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

void asm_phi_break(ASMState *as,RegSet blocked,RegSet blockedby,RegSet allow)

{
  uint uVar1;
  uint uVar2;
  Reg up;
  uint uVar3;
  
  uVar3 = allow & blocked;
  if (uVar3 != 0) {
    uVar1 = as->freeset & ~blocked & allow;
    if (uVar1 == 0) {
      up = ra_evict(as,~blocked & allow);
    }
    else {
      uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      up = uVar1 ^ 0x18;
    }
    uVar1 = ~blockedby & uVar3;
    if ((~blockedby & uVar3) == 0) {
      uVar1 = uVar3;
    }
    uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar3 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    ra_rename(as,uVar3 ^ 0x18,up);
    return;
  }
  return;
}

Assistant:

static void asm_phi_break(ASMState *as, RegSet blocked, RegSet blockedby,
			  RegSet allow)
{
  RegSet candidates = blocked & allow;
  if (candidates) {  /* If this register file has candidates. */
    /* Note: the set for ra_pick cannot be empty, since each register file
    ** has some registers never allocated to PHIs.
    */
    Reg down, up = ra_pick(as, ~blocked & allow);  /* Get a free register. */
    if (candidates & ~blockedby)  /* Optimize shifts, else it's a cycle. */
      candidates = candidates & ~blockedby;
    down = rset_picktop(candidates);  /* Pick candidate PHI register. */
    ra_rename(as, down, up);  /* And rename it to the free register. */
  }
}